

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getnameinfo.c
# Opt level: O3

int run_test_getnameinfo_basic_ip6(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  pcVar3 = "::1";
  iVar1 = uv_ip6_addr("::1",0x50,&addr6);
  if (iVar1 == 0) {
    pcVar3 = (char *)uv_default_loop();
    iVar1 = uv_getnameinfo(pcVar3,&req,getnameinfo_req,&addr6,0);
    if (iVar1 == 0) {
      uVar2 = uv_default_loop();
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      pcVar3 = (char *)uv_default_loop();
      iVar1 = uv_loop_close(pcVar3);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0015bc2d;
    }
  }
  else {
    run_test_getnameinfo_basic_ip6_cold_1();
  }
  run_test_getnameinfo_basic_ip6_cold_2();
LAB_0015bc2d:
  run_test_getnameinfo_basic_ip6_cold_3();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(pcVar3,0);
  return iVar1;
}

Assistant:

TEST_IMPL(getnameinfo_basic_ip6) {
  int r;

  r = uv_ip6_addr(address_ip6, port, &addr6);
  ASSERT(r == 0);

  r = uv_getnameinfo(uv_default_loop(),
                     &req,
                     &getnameinfo_req,
                     (const struct sockaddr*)&addr6,
                     0);
  ASSERT(r == 0);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}